

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opextinst_forward_ref_fixup_pass.cpp
# Opt level: O0

unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
* spvtools::opt::anon_unknown_11::gatherResultIds
            (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *__return_storage_ptr__,IteratorRange<spvtools::opt::InstructionList::iterator> *range)

{
  bool bVar1;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  undefined1 local_44 [12];
  Instruction *it;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *range_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *output;
  
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(__return_storage_ptr__);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&it);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&it), bVar1) {
    local_44._4_8_ =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    local_44._0_4_ = opt::Instruction::result_id((Instruction *)local_44._4_8_);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
             __return_storage_ptr__,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_44,(value_type *)CONCAT71(extraout_var,extraout_DL));
    InstructionList::iterator::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<uint32_t> gatherResultIds(
    const IteratorRange<Module::inst_iterator>& range) {
  std::unordered_set<uint32_t> output;
  for (const auto& it : range) output.insert(it.result_id());
  return output;
}